

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcsrc.cpp
# Opt level: O3

void __thiscall
CTcSrcMemory::CTcSrcMemory(CTcSrcMemory *this,char *buf,size_t len,CCharmapToUni *mapper)

{
  char *p;
  size_t alo_len;
  char *local_40;
  long local_38;
  
  (this->super_CTcSrcObject)._vptr_CTcSrcObject = (_func_int **)&PTR__CTcSrcMemory_003570f8;
  local_38 = len * 3;
  local_40 = (char *)malloc(len * 3 + 1);
  this->buf_alo_ = local_40;
  (*(mapper->super_CCharmap)._vptr_CCharmap[4])(mapper,&local_40,&local_38,buf,len);
  *local_40 = '\0';
  this->buf_ = this->buf_alo_;
  return;
}

Assistant:

CTcSrcMemory::CTcSrcMemory(const char *buf, size_t len, CCharmapToUni *mapper)
{
    /* 
     *   Allocate a buffer for a UTF8-encoded copy of the buffer -
     *   allocate three bytes per byte of the original, since this is the
     *   worst case for expansion of the encoding.  Allocate one extra
     *   byte to ensure we have space for a null terminator.  
     */
    size_t alo_len = len*3;
    buf_alo_ = (char *)t3malloc(alo_len + 1);

    /* map the buffer */
    char *p = buf_alo_;
    mapper->map(&p, &alo_len, buf, len);

    /* null-terminate the translated buffer */
    *p = '\0';

    /* start reading at the start of the translated buffer */
    buf_ = buf_alo_;
}